

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_shar.c
# Opt level: O1

int archive_write_shar_finish_entry(archive_write *a)

{
  archive_string *as;
  shar *shar;
  ulong length;
  int iVar1;
  mode_t mVar2;
  char *pcVar3;
  char *str;
  
  shar = (shar *)a->format_data;
  if (shar->entry == (archive_entry *)0x0) {
    return 0;
  }
  if (shar->dump == 0) {
    if (shar->has_data == 0) goto LAB_00151e80;
    if (shar->end_of_line == 0) {
      archive_strappend_char(&shar->work,'\n');
    }
    pcVar3 = "SHAR_END\n";
  }
  else {
    if (shar->has_data != 0) {
      if ((shar->outpos != 0) &&
         (iVar1 = _uuencode_line(a,shar,shar->outbuff,shar->outpos), iVar1 != 0)) {
        return -0x1e;
      }
      archive_strcat(&shar->work,"`\nend\n");
      archive_strcat(&shar->work,"SHAR_END\n");
    }
    as = &shar->work;
    mVar2 = archive_entry_mode(shar->entry);
    archive_string_sprintf(as,"chmod %o ",(ulong)(mVar2 & 0xfff));
    pcVar3 = archive_entry_pathname(shar->entry);
    shar_quote(as,pcVar3,1);
    archive_strcat(as,"\n");
    pcVar3 = archive_entry_uname(shar->entry);
    str = archive_entry_gname(shar->entry);
    if (pcVar3 != (char *)0x0 || str != (char *)0x0) {
      archive_strcat(as,"chown ");
      if (pcVar3 != (char *)0x0) {
        shar_quote(as,pcVar3,1);
      }
      if (str != (char *)0x0) {
        archive_strcat(as,":");
        shar_quote(as,str,1);
      }
      archive_strcat(as," ");
      pcVar3 = archive_entry_pathname(shar->entry);
      shar_quote(as,pcVar3,1);
      archive_strcat(as,"\n");
    }
    pcVar3 = archive_entry_fflags_text(shar->entry);
    if (pcVar3 == (char *)0x0) goto LAB_00151e80;
    archive_string_sprintf(as,"chflags %s ",pcVar3);
    pcVar3 = archive_entry_pathname(shar->entry);
    shar_quote(as,pcVar3,1);
    pcVar3 = "\n";
  }
  archive_strcat(&shar->work,pcVar3);
LAB_00151e80:
  archive_entry_free(shar->entry);
  shar->entry = (archive_entry *)0x0;
  length = (shar->work).length;
  if (0xffff < length) {
    iVar1 = __archive_write_output(a,(shar->work).s,length);
    if (iVar1 != 0) {
      return -0x1e;
    }
    (shar->work).length = 0;
  }
  return 0;
}

Assistant:

static int
archive_write_shar_finish_entry(struct archive_write *a)
{
	const char *g, *p, *u;
	struct shar *shar;
	int ret;

	shar = (struct shar *)a->format_data;
	if (shar->entry == NULL)
		return (0);

	if (shar->dump) {
		/* Finish uuencoded data. */
		if (shar->has_data) {
			if (shar->outpos > 0)
				uuencode_line(a, shar, shar->outbuff,
				    shar->outpos);
			archive_strcat(&shar->work, "`\nend\n");
			archive_strcat(&shar->work, "SHAR_END\n");
		}
		/* Restore file mode, owner, flags. */
		/*
		 * TODO: Don't immediately restore mode for
		 * directories; defer that to end of script.
		 */
		archive_string_sprintf(&shar->work, "chmod %o ",
		    (unsigned int)(archive_entry_mode(shar->entry) & 07777));
		shar_quote(&shar->work, archive_entry_pathname(shar->entry), 1);
		archive_strcat(&shar->work, "\n");

		u = archive_entry_uname(shar->entry);
		g = archive_entry_gname(shar->entry);
		if (u != NULL || g != NULL) {
			archive_strcat(&shar->work, "chown ");
			if (u != NULL)
				shar_quote(&shar->work, u, 1);
			if (g != NULL) {
				archive_strcat(&shar->work, ":");
				shar_quote(&shar->work, g, 1);
			}
			archive_strcat(&shar->work, " ");
			shar_quote(&shar->work,
			    archive_entry_pathname(shar->entry), 1);
			archive_strcat(&shar->work, "\n");
		}

		if ((p = archive_entry_fflags_text(shar->entry)) != NULL) {
			archive_string_sprintf(&shar->work, "chflags %s ", p);
			shar_quote(&shar->work,
			    archive_entry_pathname(shar->entry), 1);
			archive_strcat(&shar->work, "\n");
		}

		/* TODO: restore ACLs */

	} else {
		if (shar->has_data) {
			/* Finish sed-encoded data:  ensure last line ends. */
			if (!shar->end_of_line)
				archive_strappend_char(&shar->work, '\n');
			archive_strcat(&shar->work, "SHAR_END\n");
		}
	}

	archive_entry_free(shar->entry);
	shar->entry = NULL;

	if (shar->work.length < 65536)
		return (ARCHIVE_OK);

	ret = __archive_write_output(a, shar->work.s, shar->work.length);
	if (ret != ARCHIVE_OK)
		return (ARCHIVE_FATAL);
	archive_string_empty(&shar->work);

	return (ARCHIVE_OK);
}